

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_controller.cpp
# Opt level: O0

void __thiscall so_5::stats::impl::std_controller_t::turn_off(std_controller_t *this)

{
  bool bVar1;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> cond_lock;
  lock_guard<std::mutex> lock;
  std_controller_t *this_local;
  
  std::lock_guard<std::mutex>::lock_guard(&cond_lock,&this->m_start_stop_lock);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_distribution_thread);
  if (bVar1) {
    std::lock_guard<std::mutex>::lock_guard(&local_20,&this->m_data_lock);
    this->m_shutdown_initiated = true;
    std::condition_variable::notify_one();
    std::lock_guard<std::mutex>::~lock_guard(&local_20);
    std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::operator->
              (&this->m_distribution_thread);
    std::thread::join();
    std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::reset
              (&this->m_distribution_thread,(pointer)0x0);
  }
  std::lock_guard<std::mutex>::~lock_guard(&cond_lock);
  return;
}

Assistant:

void
std_controller_t::turn_off()
	{
		std::lock_guard< std::mutex > lock{ m_start_stop_lock };

		if( m_distribution_thread )
			{
				{
					// Send shutdown signal to work thread.
					std::lock_guard< std::mutex > cond_lock{ m_data_lock };
					m_shutdown_initiated = true;

					m_wake_up_cond.notify_one();
				}

				// Wait for work thread termination.
				m_distribution_thread->join();

				// Pointer to work thread must be dropped.
				// This allows to start new working thread.
				m_distribution_thread.reset();
			}
	}